

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.h
# Opt level: O0

bool __thiscall Diligent::SamplerDesc::operator==(SamplerDesc *this,SamplerDesc *RHS)

{
  bool local_19;
  SamplerDesc *RHS_local;
  SamplerDesc *this_local;
  
  local_19 = false;
  if (((((this->MinFilter == RHS->MinFilter) &&
        (local_19 = false, this->MagFilter == RHS->MagFilter)) &&
       (local_19 = false, this->MipFilter == RHS->MipFilter)) &&
      ((local_19 = false, this->AddressU == RHS->AddressU &&
       (local_19 = false, this->AddressV == RHS->AddressV)))) &&
     ((local_19 = false, this->AddressW == RHS->AddressW &&
      ((local_19 = false, this->Flags == RHS->Flags &&
       (local_19 = false, (this->UnnormalizedCoords & 1U) == (RHS->UnnormalizedCoords & 1U))))))) {
    local_19 = false;
    if (((float)this->MipLODBias == (float)RHS->MipLODBias) &&
       (((!NAN((float)this->MipLODBias) && !NAN((float)RHS->MipLODBias) &&
         (local_19 = false, this->MaxAnisotropy == RHS->MaxAnisotropy)) &&
        (local_19 = false, this->ComparisonFunc == RHS->ComparisonFunc)))) {
      local_19 = false;
      if (((float)this->BorderColor[0] == (float)RHS->BorderColor[0]) &&
         (!NAN((float)this->BorderColor[0]) && !NAN((float)RHS->BorderColor[0]))) {
        local_19 = false;
        if (((float)this->BorderColor[1] == (float)RHS->BorderColor[1]) &&
           (!NAN((float)this->BorderColor[1]) && !NAN((float)RHS->BorderColor[1]))) {
          local_19 = false;
          if (((float)this->BorderColor[2] == (float)RHS->BorderColor[2]) &&
             (!NAN((float)this->BorderColor[2]) && !NAN((float)RHS->BorderColor[2]))) {
            local_19 = false;
            if (((float)this->BorderColor[3] == (float)RHS->BorderColor[3]) &&
               (!NAN((float)this->BorderColor[3]) && !NAN((float)RHS->BorderColor[3]))) {
              local_19 = false;
              if ((this->MinLOD == RHS->MinLOD) && (!NAN(this->MinLOD) && !NAN(RHS->MinLOD))) {
                local_19 = this->MaxLOD == RHS->MaxLOD;
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

constexpr bool operator == (const SamplerDesc& RHS)const
    {
                // Ignore Name. This is consistent with the hasher (HashCombiner<HasherType, SamplerDesc>).
        return  // strcmp(Name, RHS.Name) == 0          &&
                MinFilter          == RHS.MinFilter          &&
                MagFilter          == RHS.MagFilter          &&
                MipFilter          == RHS.MipFilter          &&
                AddressU           == RHS.AddressU           &&
                AddressV           == RHS.AddressV           &&
                AddressW           == RHS.AddressW           &&
                Flags              == RHS.Flags              &&
                UnnormalizedCoords == RHS.UnnormalizedCoords &&
                MipLODBias         == RHS.MipLODBias         &&
                MaxAnisotropy      == RHS.MaxAnisotropy      &&
                ComparisonFunc     == RHS.ComparisonFunc     &&
                BorderColor[0]     == RHS.BorderColor[0]     &&
                BorderColor[1]     == RHS.BorderColor[1]     &&
                BorderColor[2]     == RHS.BorderColor[2]     &&
                BorderColor[3]     == RHS.BorderColor[3]     &&
                MinLOD             == RHS.MinLOD             &&
                MaxLOD             == RHS.MaxLOD;
    }